

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_257,_true,_embree::sse42::VirtualCurveIntersectorK<4>,_true>::
     intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
               RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  size_t sVar9;
  undefined8 uVar10;
  long lVar11;
  undefined1 auVar12 [16];
  bool bVar13;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar14;
  int iVar15;
  undefined4 uVar16;
  ulong unaff_RBX;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar17;
  ulong uVar18;
  ulong uVar19;
  size_t sVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  vint4 bi_1;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  float fVar39;
  float fVar45;
  float fVar46;
  vint4 ai;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar47;
  undefined1 auVar43 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar44;
  float fVar48;
  float fVar54;
  float fVar55;
  vint4 ai_3;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar56;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar53;
  float fVar57;
  float fVar62;
  float fVar63;
  vint4 ai_1;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar64;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar65;
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar69;
  float fVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar86;
  float fVar87;
  vint4 bi_3;
  undefined1 auVar84 [16];
  float fVar88;
  undefined1 auVar85 [16];
  float fVar89;
  float fVar90;
  float fVar93;
  float fVar94;
  vint4 bi;
  undefined1 auVar91 [16];
  float fVar95;
  undefined1 auVar92 [16];
  undefined1 auVar96 [16];
  uint uVar97;
  uint uVar98;
  uint uVar99;
  uint uVar100;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar17 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar2 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar4 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar5 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fVar6 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar7 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar79 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar80 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar81 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar89 = fVar79 * 0.99999964;
  fVar73 = fVar80 * 0.99999964;
  fVar82 = fVar81 * 0.99999964;
  fVar79 = fVar79 * 1.0000004;
  fVar80 = fVar80 * 1.0000004;
  fVar81 = fVar81 * 1.0000004;
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar35 = (tray->tnear).field_0.i[k];
  auVar78._4_4_ = iVar35;
  auVar78._0_4_ = iVar35;
  auVar78._8_4_ = iVar35;
  auVar78._12_4_ = iVar35;
  iVar35 = (tray->tfar).field_0.i[k];
  iVar36 = iVar35;
  iVar37 = iVar35;
  iVar38 = iVar35;
  do {
    do {
      if (pSVar17 == stack) {
        return;
      }
      pSVar14 = pSVar17 + -1;
      pSVar17 = pSVar17 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar14->dist &&
             (float)pSVar14->dist != *(float *)(ray + k * 4 + 0x80));
    sVar20 = (pSVar17->ptr).ptr;
    do {
      if ((sVar20 & 0xf) == 0) {
        pfVar1 = (float *)(sVar20 + 0x20 + uVar23);
        auVar24._0_4_ = (*pfVar1 - fVar2) * fVar89;
        auVar24._4_4_ = (pfVar1[1] - fVar2) * fVar89;
        auVar24._8_4_ = (pfVar1[2] - fVar2) * fVar89;
        auVar24._12_4_ = (pfVar1[3] - fVar2) * fVar89;
        pfVar1 = (float *)(sVar20 + 0x20 + uVar18);
        auVar40._0_4_ = (*pfVar1 - fVar3) * fVar73;
        auVar40._4_4_ = (pfVar1[1] - fVar3) * fVar73;
        auVar40._8_4_ = (pfVar1[2] - fVar3) * fVar73;
        auVar40._12_4_ = (pfVar1[3] - fVar3) * fVar73;
        auVar25 = maxps(auVar24,auVar40);
        pfVar1 = (float *)(sVar20 + 0x20 + uVar22);
        auVar41._0_4_ = (*pfVar1 - fVar4) * fVar82;
        auVar41._4_4_ = (pfVar1[1] - fVar4) * fVar82;
        auVar41._8_4_ = (pfVar1[2] - fVar4) * fVar82;
        auVar41._12_4_ = (pfVar1[3] - fVar4) * fVar82;
        pfVar1 = (float *)(sVar20 + 0x20 + (uVar23 ^ 0x10));
        auVar49._0_4_ = (*pfVar1 - fVar2) * fVar79;
        auVar49._4_4_ = (pfVar1[1] - fVar2) * fVar79;
        auVar49._8_4_ = (pfVar1[2] - fVar2) * fVar79;
        auVar49._12_4_ = (pfVar1[3] - fVar2) * fVar79;
        pfVar1 = (float *)(sVar20 + 0x20 + (uVar18 ^ 0x10));
        auVar58._0_4_ = (*pfVar1 - fVar3) * fVar80;
        auVar58._4_4_ = (pfVar1[1] - fVar3) * fVar80;
        auVar58._8_4_ = (pfVar1[2] - fVar3) * fVar80;
        auVar58._12_4_ = (pfVar1[3] - fVar3) * fVar80;
        auVar50 = minps(auVar49,auVar58);
        pfVar1 = (float *)(sVar20 + 0x20 + (uVar22 ^ 0x10));
        auVar59._0_4_ = (*pfVar1 - fVar4) * fVar81;
        auVar59._4_4_ = (pfVar1[1] - fVar4) * fVar81;
        auVar59._8_4_ = (pfVar1[2] - fVar4) * fVar81;
        auVar59._12_4_ = (pfVar1[3] - fVar4) * fVar81;
        auVar42 = maxps(auVar41,auVar78);
        tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar25,auVar42);
        auVar12._4_4_ = iVar36;
        auVar12._0_4_ = iVar35;
        auVar12._8_4_ = iVar37;
        auVar12._12_4_ = iVar38;
        auVar25 = minps(auVar59,auVar12);
        auVar25 = minps(auVar50,auVar25);
        auVar26._4_4_ = -(uint)(tNear.field_0._4_4_ <= auVar25._4_4_);
        auVar26._0_4_ = -(uint)(tNear.field_0._0_4_ <= auVar25._0_4_);
        auVar26._8_4_ = -(uint)(tNear.field_0._8_4_ <= auVar25._8_4_);
        auVar26._12_4_ = -(uint)(tNear.field_0._12_4_ <= auVar25._12_4_);
        uVar16 = movmskps((int)unaff_RBX,auVar26);
LAB_0029ecf4:
        unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar16);
        bVar13 = true;
      }
      else {
        if ((int)(sVar20 & 0xf) == 2) {
          uVar19 = sVar20 & 0xfffffffffffffff0;
          auVar84._0_4_ =
               fVar5 * *(float *)(uVar19 + 0x20) +
               fVar6 * *(float *)(uVar19 + 0x50) + fVar7 * *(float *)(uVar19 + 0x80);
          auVar84._4_4_ =
               fVar5 * *(float *)(uVar19 + 0x24) +
               fVar6 * *(float *)(uVar19 + 0x54) + fVar7 * *(float *)(uVar19 + 0x84);
          auVar84._8_4_ =
               fVar5 * *(float *)(uVar19 + 0x28) +
               fVar6 * *(float *)(uVar19 + 0x58) + fVar7 * *(float *)(uVar19 + 0x88);
          auVar84._12_4_ =
               fVar5 * *(float *)(uVar19 + 0x2c) +
               fVar6 * *(float *)(uVar19 + 0x5c) + fVar7 * *(float *)(uVar19 + 0x8c);
          auVar91._0_4_ =
               fVar5 * *(float *)(uVar19 + 0x30) +
               fVar6 * *(float *)(uVar19 + 0x60) + fVar7 * *(float *)(uVar19 + 0x90);
          auVar91._4_4_ =
               fVar5 * *(float *)(uVar19 + 0x34) +
               fVar6 * *(float *)(uVar19 + 100) + fVar7 * *(float *)(uVar19 + 0x94);
          auVar91._8_4_ =
               fVar5 * *(float *)(uVar19 + 0x38) +
               fVar6 * *(float *)(uVar19 + 0x68) + fVar7 * *(float *)(uVar19 + 0x98);
          auVar91._12_4_ =
               fVar5 * *(float *)(uVar19 + 0x3c) +
               fVar6 * *(float *)(uVar19 + 0x6c) + fVar7 * *(float *)(uVar19 + 0x9c);
          auVar96._0_4_ =
               fVar5 * *(float *)(uVar19 + 0x40) +
               fVar6 * *(float *)(uVar19 + 0x70) + fVar7 * *(float *)(uVar19 + 0xa0);
          auVar96._4_4_ =
               fVar5 * *(float *)(uVar19 + 0x44) +
               fVar6 * *(float *)(uVar19 + 0x74) + fVar7 * *(float *)(uVar19 + 0xa4);
          auVar96._8_4_ =
               fVar5 * *(float *)(uVar19 + 0x48) +
               fVar6 * *(float *)(uVar19 + 0x78) + fVar7 * *(float *)(uVar19 + 0xa8);
          auVar96._12_4_ =
               fVar5 * *(float *)(uVar19 + 0x4c) +
               fVar6 * *(float *)(uVar19 + 0x7c) + fVar7 * *(float *)(uVar19 + 0xac);
          uVar97 = (uint)DAT_01fec6c0;
          uVar98 = DAT_01fec6c0._4_4_;
          uVar99 = DAT_01fec6c0._8_4_;
          uVar100 = DAT_01fec6c0._12_4_;
          fVar65 = (float)DAT_01ff1d40;
          fVar70 = DAT_01ff1d40._4_4_;
          fVar71 = DAT_01ff1d40._8_4_;
          fVar72 = DAT_01ff1d40._12_4_;
          auVar25._4_4_ = -(uint)((float)((uint)auVar84._4_4_ & uVar98) < fVar70);
          auVar25._0_4_ = -(uint)((float)((uint)auVar84._0_4_ & uVar97) < fVar65);
          auVar25._8_4_ = -(uint)((float)((uint)auVar84._8_4_ & uVar99) < fVar71);
          auVar25._12_4_ = -(uint)((float)((uint)auVar84._12_4_ & uVar100) < fVar72);
          auVar25 = blendvps(auVar84,_DAT_01ff1d40,auVar25);
          auVar42._4_4_ = -(uint)((float)((uint)auVar91._4_4_ & uVar98) < fVar70);
          auVar42._0_4_ = -(uint)((float)((uint)auVar91._0_4_ & uVar97) < fVar65);
          auVar42._8_4_ = -(uint)((float)((uint)auVar91._8_4_ & uVar99) < fVar71);
          auVar42._12_4_ = -(uint)((float)((uint)auVar91._12_4_ & uVar100) < fVar72);
          auVar42 = blendvps(auVar91,_DAT_01ff1d40,auVar42);
          auVar50._4_4_ = -(uint)((float)((uint)auVar96._4_4_ & uVar98) < fVar70);
          auVar50._0_4_ = -(uint)((float)((uint)auVar96._0_4_ & uVar97) < fVar65);
          auVar50._8_4_ = -(uint)((float)((uint)auVar96._8_4_ & uVar99) < fVar71);
          auVar50._12_4_ = -(uint)((float)((uint)auVar96._12_4_ & uVar100) < fVar72);
          auVar50 = blendvps(auVar96,_DAT_01ff1d40,auVar50);
          auVar68 = rcpps(_DAT_01fec6c0,auVar25);
          fVar65 = auVar68._0_4_;
          fVar70 = auVar68._4_4_;
          fVar71 = auVar68._8_4_;
          fVar72 = auVar68._12_4_;
          fVar65 = (1.0 - auVar25._0_4_ * fVar65) * fVar65 + fVar65;
          fVar70 = (1.0 - auVar25._4_4_ * fVar70) * fVar70 + fVar70;
          fVar71 = (1.0 - auVar25._8_4_ * fVar71) * fVar71 + fVar71;
          fVar72 = (1.0 - auVar25._12_4_ * fVar72) * fVar72 + fVar72;
          auVar25 = rcpps(auVar68,auVar42);
          fVar83 = auVar25._0_4_;
          fVar86 = auVar25._4_4_;
          fVar87 = auVar25._8_4_;
          fVar88 = auVar25._12_4_;
          fVar83 = (1.0 - auVar42._0_4_ * fVar83) * fVar83 + fVar83;
          fVar86 = (1.0 - auVar42._4_4_ * fVar86) * fVar86 + fVar86;
          fVar87 = (1.0 - auVar42._8_4_ * fVar87) * fVar87 + fVar87;
          fVar88 = (1.0 - auVar42._12_4_ * fVar88) * fVar88 + fVar88;
          auVar25 = rcpps(auVar25,auVar50);
          fVar90 = auVar25._0_4_;
          fVar93 = auVar25._4_4_;
          fVar94 = auVar25._8_4_;
          fVar95 = auVar25._12_4_;
          fVar90 = (1.0 - auVar50._0_4_ * fVar90) * fVar90 + fVar90;
          fVar93 = (1.0 - auVar50._4_4_ * fVar93) * fVar93 + fVar93;
          fVar94 = (1.0 - auVar50._8_4_ * fVar94) * fVar94 + fVar94;
          fVar95 = (1.0 - auVar50._12_4_ * fVar95) * fVar95 + fVar95;
          fVar57 = (*(float *)(uVar19 + 0x20) * fVar2 +
                   *(float *)(uVar19 + 0x50) * fVar3 +
                   *(float *)(uVar19 + 0x80) * fVar4 + *(float *)(uVar19 + 0xb0)) * -fVar65;
          fVar62 = (*(float *)(uVar19 + 0x24) * fVar2 +
                   *(float *)(uVar19 + 0x54) * fVar3 +
                   *(float *)(uVar19 + 0x84) * fVar4 + *(float *)(uVar19 + 0xb4)) * -fVar70;
          fVar63 = (*(float *)(uVar19 + 0x28) * fVar2 +
                   *(float *)(uVar19 + 0x58) * fVar3 +
                   *(float *)(uVar19 + 0x88) * fVar4 + *(float *)(uVar19 + 0xb8)) * -fVar71;
          fVar64 = (*(float *)(uVar19 + 0x2c) * fVar2 +
                   *(float *)(uVar19 + 0x5c) * fVar3 +
                   *(float *)(uVar19 + 0x8c) * fVar4 + *(float *)(uVar19 + 0xbc)) * -fVar72;
          fVar48 = (*(float *)(uVar19 + 0x30) * fVar2 +
                   *(float *)(uVar19 + 0x60) * fVar3 +
                   *(float *)(uVar19 + 0x90) * fVar4 + *(float *)(uVar19 + 0xc0)) * -fVar83;
          fVar54 = (*(float *)(uVar19 + 0x34) * fVar2 +
                   *(float *)(uVar19 + 100) * fVar3 +
                   *(float *)(uVar19 + 0x94) * fVar4 + *(float *)(uVar19 + 0xc4)) * -fVar86;
          fVar55 = (*(float *)(uVar19 + 0x38) * fVar2 +
                   *(float *)(uVar19 + 0x68) * fVar3 +
                   *(float *)(uVar19 + 0x98) * fVar4 + *(float *)(uVar19 + 200)) * -fVar87;
          fVar56 = (*(float *)(uVar19 + 0x3c) * fVar2 +
                   *(float *)(uVar19 + 0x6c) * fVar3 +
                   *(float *)(uVar19 + 0x9c) * fVar4 + *(float *)(uVar19 + 0xcc)) * -fVar88;
          fVar39 = (*(float *)(uVar19 + 0x40) * fVar2 +
                   *(float *)(uVar19 + 0x70) * fVar3 +
                   *(float *)(uVar19 + 0xa0) * fVar4 + *(float *)(uVar19 + 0xd0)) * -fVar90;
          fVar45 = (*(float *)(uVar19 + 0x44) * fVar2 +
                   *(float *)(uVar19 + 0x74) * fVar3 +
                   *(float *)(uVar19 + 0xa4) * fVar4 + *(float *)(uVar19 + 0xd4)) * -fVar93;
          fVar46 = (*(float *)(uVar19 + 0x48) * fVar2 +
                   *(float *)(uVar19 + 0x78) * fVar3 +
                   *(float *)(uVar19 + 0xa8) * fVar4 + *(float *)(uVar19 + 0xd8)) * -fVar94;
          fVar47 = (*(float *)(uVar19 + 0x4c) * fVar2 +
                   *(float *)(uVar19 + 0x7c) * fVar3 +
                   *(float *)(uVar19 + 0xac) * fVar4 + *(float *)(uVar19 + 0xdc)) * -fVar95;
          fVar65 = fVar65 + fVar57;
          fVar70 = fVar70 + fVar62;
          fVar71 = fVar71 + fVar63;
          fVar72 = fVar72 + fVar64;
          fVar83 = fVar83 + fVar48;
          fVar86 = fVar86 + fVar54;
          fVar87 = fVar87 + fVar55;
          fVar88 = fVar88 + fVar56;
          fVar90 = fVar90 + fVar39;
          fVar93 = fVar93 + fVar45;
          fVar94 = fVar94 + fVar46;
          fVar95 = fVar95 + fVar47;
          auVar66._0_4_ =
               (uint)((int)fVar83 < (int)fVar48) * (int)fVar83 |
               (uint)((int)fVar83 >= (int)fVar48) * (int)fVar48;
          auVar66._4_4_ =
               (uint)((int)fVar86 < (int)fVar54) * (int)fVar86 |
               (uint)((int)fVar86 >= (int)fVar54) * (int)fVar54;
          auVar66._8_4_ =
               (uint)((int)fVar87 < (int)fVar55) * (int)fVar87 |
               (uint)((int)fVar87 >= (int)fVar55) * (int)fVar55;
          auVar66._12_4_ =
               (uint)((int)fVar88 < (int)fVar56) * (int)fVar88 |
               (uint)((int)fVar88 >= (int)fVar56) * (int)fVar56;
          auVar74._0_4_ =
               (uint)((int)fVar90 < (int)fVar39) * (int)fVar90 |
               (uint)((int)fVar90 >= (int)fVar39) * (int)fVar39;
          auVar74._4_4_ =
               (uint)((int)fVar93 < (int)fVar45) * (int)fVar93 |
               (uint)((int)fVar93 >= (int)fVar45) * (int)fVar45;
          auVar74._8_4_ =
               (uint)((int)fVar94 < (int)fVar46) * (int)fVar94 |
               (uint)((int)fVar94 >= (int)fVar46) * (int)fVar46;
          auVar74._12_4_ =
               (uint)((int)fVar95 < (int)fVar47) * (int)fVar95 |
               (uint)((int)fVar95 >= (int)fVar47) * (int)fVar47;
          auVar42 = maxps(auVar66,auVar74);
          auVar75._0_4_ =
               (uint)((int)fVar65 < (int)fVar57) * (int)fVar65 |
               (uint)((int)fVar65 >= (int)fVar57) * (int)fVar57;
          auVar75._4_4_ =
               (uint)((int)fVar70 < (int)fVar62) * (int)fVar70 |
               (uint)((int)fVar70 >= (int)fVar62) * (int)fVar62;
          auVar75._8_4_ =
               (uint)((int)fVar71 < (int)fVar63) * (int)fVar71 |
               (uint)((int)fVar71 >= (int)fVar63) * (int)fVar63;
          auVar75._12_4_ =
               (uint)((int)fVar72 < (int)fVar64) * (int)fVar72 |
               (uint)((int)fVar72 >= (int)fVar64) * (int)fVar64;
          auVar68._0_4_ =
               (uint)((int)fVar65 < (int)fVar57) * (int)fVar57 |
               (uint)((int)fVar65 >= (int)fVar57) * (int)fVar65;
          auVar68._4_4_ =
               (uint)((int)fVar70 < (int)fVar62) * (int)fVar62 |
               (uint)((int)fVar70 >= (int)fVar62) * (int)fVar70;
          auVar68._8_4_ =
               (uint)((int)fVar71 < (int)fVar63) * (int)fVar63 |
               (uint)((int)fVar71 >= (int)fVar63) * (int)fVar71;
          auVar68._12_4_ =
               (uint)((int)fVar72 < (int)fVar64) * (int)fVar64 |
               (uint)((int)fVar72 >= (int)fVar64) * (int)fVar72;
          auVar85._0_4_ =
               (uint)((int)fVar83 < (int)fVar48) * (int)fVar48 |
               (uint)((int)fVar83 >= (int)fVar48) * (int)fVar83;
          auVar85._4_4_ =
               (uint)((int)fVar86 < (int)fVar54) * (int)fVar54 |
               (uint)((int)fVar86 >= (int)fVar54) * (int)fVar86;
          auVar85._8_4_ =
               (uint)((int)fVar87 < (int)fVar55) * (int)fVar55 |
               (uint)((int)fVar87 >= (int)fVar55) * (int)fVar87;
          auVar85._12_4_ =
               (uint)((int)fVar88 < (int)fVar56) * (int)fVar56 |
               (uint)((int)fVar88 >= (int)fVar56) * (int)fVar88;
          auVar92._0_4_ =
               (uint)((int)fVar90 < (int)fVar39) * (int)fVar39 |
               (uint)((int)fVar90 >= (int)fVar39) * (int)fVar90;
          auVar92._4_4_ =
               (uint)((int)fVar93 < (int)fVar45) * (int)fVar45 |
               (uint)((int)fVar93 >= (int)fVar45) * (int)fVar93;
          auVar92._8_4_ =
               (uint)((int)fVar94 < (int)fVar46) * (int)fVar46 |
               (uint)((int)fVar94 >= (int)fVar46) * (int)fVar94;
          auVar92._12_4_ =
               (uint)((int)fVar95 < (int)fVar47) * (int)fVar47 |
               (uint)((int)fVar95 >= (int)fVar47) * (int)fVar95;
          auVar50 = minps(auVar85,auVar92);
          auVar25 = maxps(auVar78,auVar75);
          auVar25 = maxps(auVar25,auVar42);
          auVar51._4_4_ = iVar36;
          auVar51._0_4_ = iVar35;
          auVar51._8_4_ = iVar37;
          auVar51._12_4_ = iVar38;
          auVar42 = minps(auVar51,auVar68);
          auVar42 = minps(auVar42,auVar50);
          tNear.field_0.v[0] = auVar25._0_4_ * 0.99999964;
          tNear.field_0.v[1] = auVar25._4_4_ * 0.99999964;
          tNear.field_0.v[2] = auVar25._8_4_ * 0.99999964;
          tNear.field_0.v[3] = auVar25._12_4_ * 0.99999964;
          auVar77._4_4_ = -(uint)(tNear.field_0.v[1] <= auVar42._4_4_ * 1.0000004);
          auVar77._0_4_ = -(uint)(tNear.field_0.v[0] <= auVar42._0_4_ * 1.0000004);
          auVar77._8_4_ = -(uint)(tNear.field_0.v[2] <= auVar42._8_4_ * 1.0000004);
          auVar77._12_4_ = -(uint)(tNear.field_0.v[3] <= auVar42._12_4_ * 1.0000004);
          uVar16 = movmskps((int)unaff_RBX,auVar77);
          goto LAB_0029ecf4;
        }
        bVar13 = false;
      }
      if (bVar13) {
        if (unaff_RBX == 0) {
          iVar15 = 4;
        }
        else {
          uVar19 = sVar20 & 0xfffffffffffffff0;
          lVar11 = 0;
          if (unaff_RBX != 0) {
            for (; (unaff_RBX >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
            }
          }
          iVar15 = 0;
          sVar20 = *(size_t *)(uVar19 + lVar11 * 8);
          uVar21 = unaff_RBX - 1 & unaff_RBX;
          if (uVar21 != 0) {
            uVar97 = tNear.field_0.i[lVar11];
            lVar11 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
              }
            }
            sVar9 = *(size_t *)(uVar19 + lVar11 * 8);
            uVar98 = tNear.field_0.i[lVar11];
            uVar21 = uVar21 - 1 & uVar21;
            if (uVar21 == 0) {
              if (uVar97 < uVar98) {
                (pSVar17->ptr).ptr = sVar9;
                pSVar17->dist = uVar98;
                pSVar17 = pSVar17 + 1;
              }
              else {
                (pSVar17->ptr).ptr = sVar20;
                pSVar17->dist = uVar97;
                pSVar17 = pSVar17 + 1;
                sVar20 = sVar9;
              }
            }
            else {
              auVar43._8_4_ = uVar97;
              auVar43._0_8_ = sVar20;
              auVar43._12_4_ = 0;
              auVar60._8_4_ = uVar98;
              auVar60._0_8_ = sVar9;
              auVar60._12_4_ = 0;
              lVar11 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                }
              }
              uVar10 = *(undefined8 *)(uVar19 + lVar11 * 8);
              iVar8 = tNear.field_0.i[lVar11];
              auVar52._8_4_ = iVar8;
              auVar52._0_8_ = uVar10;
              auVar52._12_4_ = 0;
              auVar27._8_4_ = -(uint)((int)uVar97 < (int)uVar98);
              uVar21 = uVar21 - 1 & uVar21;
              if (uVar21 == 0) {
                auVar27._4_4_ = auVar27._8_4_;
                auVar27._0_4_ = auVar27._8_4_;
                auVar27._12_4_ = auVar27._8_4_;
                auVar67._8_4_ = uVar98;
                auVar67._0_8_ = sVar9;
                auVar67._12_4_ = 0;
                auVar50 = blendvps(auVar67,auVar43,auVar27);
                auVar25 = blendvps(auVar43,auVar60,auVar27);
                auVar28._8_4_ = -(uint)(auVar50._8_4_ < iVar8);
                auVar28._4_4_ = auVar28._8_4_;
                auVar28._0_4_ = auVar28._8_4_;
                auVar28._12_4_ = auVar28._8_4_;
                auVar61._8_4_ = iVar8;
                auVar61._0_8_ = uVar10;
                auVar61._12_4_ = 0;
                auVar42 = blendvps(auVar61,auVar50,auVar28);
                auVar50 = blendvps(auVar50,auVar52,auVar28);
                auVar29._8_4_ = -(uint)(auVar25._8_4_ < auVar50._8_4_);
                auVar29._4_4_ = auVar29._8_4_;
                auVar29._0_4_ = auVar29._8_4_;
                auVar29._12_4_ = auVar29._8_4_;
                SVar53 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar50,auVar25,auVar29);
                SVar44 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar25,auVar50,auVar29);
                *pSVar17 = SVar44;
                pSVar17[1] = SVar53;
                sVar20 = auVar42._0_8_;
                pSVar17 = pSVar17 + 2;
              }
              else {
                lVar11 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                  }
                }
                auVar30._4_4_ = auVar27._8_4_;
                auVar30._0_4_ = auVar27._8_4_;
                auVar30._8_4_ = auVar27._8_4_;
                auVar30._12_4_ = auVar27._8_4_;
                auVar68 = blendvps(auVar60,auVar43,auVar30);
                auVar25 = blendvps(auVar43,auVar60,auVar30);
                auVar76._8_4_ = tNear.field_0.i[lVar11];
                auVar76._0_8_ = *(undefined8 *)(uVar19 + lVar11 * 8);
                auVar76._12_4_ = 0;
                auVar31._8_4_ = -(uint)(iVar8 < tNear.field_0.i[lVar11]);
                auVar31._4_4_ = auVar31._8_4_;
                auVar31._0_4_ = auVar31._8_4_;
                auVar31._12_4_ = auVar31._8_4_;
                auVar50 = blendvps(auVar76,auVar52,auVar31);
                auVar42 = blendvps(auVar52,auVar76,auVar31);
                auVar32._8_4_ = -(uint)(auVar25._8_4_ < auVar42._8_4_);
                auVar32._4_4_ = auVar32._8_4_;
                auVar32._0_4_ = auVar32._8_4_;
                auVar32._12_4_ = auVar32._8_4_;
                auVar77 = blendvps(auVar42,auVar25,auVar32);
                SVar44 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar25,auVar42,auVar32);
                auVar33._8_4_ = -(uint)(auVar68._8_4_ < auVar50._8_4_);
                auVar33._4_4_ = auVar33._8_4_;
                auVar33._0_4_ = auVar33._8_4_;
                auVar33._12_4_ = auVar33._8_4_;
                auVar25 = blendvps(auVar50,auVar68,auVar33);
                auVar42 = blendvps(auVar68,auVar50,auVar33);
                auVar34._8_4_ = -(uint)(auVar42._8_4_ < auVar77._8_4_);
                auVar34._4_4_ = auVar34._8_4_;
                auVar34._0_4_ = auVar34._8_4_;
                auVar34._12_4_ = auVar34._8_4_;
                SVar53 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar77,auVar42,auVar34);
                SVar69 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar42,auVar77,auVar34);
                *pSVar17 = SVar44;
                pSVar17[1] = SVar69;
                pSVar17[2] = SVar53;
                sVar20 = auVar25._0_8_;
                pSVar17 = pSVar17 + 3;
              }
            }
          }
        }
      }
      else {
        iVar15 = 6;
      }
    } while (iVar15 == 0);
    if (iVar15 == 6) {
      (**(code **)((long)This->leafIntersector +
                  (ulong)*(byte *)(sVar20 & 0xfffffffffffffff0) * 0x40 + 0x10))(pre,ray,k,context);
      iVar35 = *(int *)(ray + k * 4 + 0x80);
      iVar36 = iVar35;
      iVar37 = iVar35;
      iVar38 = iVar35;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }